

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_diff.cpp
# Opt level: O2

void __thiscall argparse::args_t::args_t(args_t *this,int argc,char **argv)

{
  int iVar1;
  undefined8 in_RAX;
  char *pcVar2;
  undefined8 uStack_38;
  
  this->input_master = (FILE *)0x0;
  this->input_add = _stdin;
  this->output = _stdout;
  this->op = add;
  this->checks = id;
  this->quiet = false;
  iVar1 = 1;
  uStack_38 = in_RAX;
  do {
    uStack_38 = CONCAT44(iVar1,(undefined4)uStack_38);
    if (argc <= iVar1) {
      if (this->input_master == (FILE *)0x0) {
        ERROR("Required argument MASTER FILE was not provided");
        return;
      }
      return;
    }
    pcVar2 = argv[iVar1];
    if (*pcVar2 == '-') {
      switch(pcVar2[1]) {
      case 'h':
        if (pcVar2[2] != '\0') goto switchD_00108af8_caseD_69;
LAB_00108bd0:
        help();
        break;
      case 'm':
        pcVar2 = next_arg((int *)((long)&uStack_38 + 4),argc,argv);
        parse_input_master(this,pcVar2);
        break;
      case 'o':
        pcVar2 = next_arg((int *)((long)&uStack_38 + 4),argc,argv);
        parse_output(this,pcVar2);
        break;
      case 'p':
        pcVar2 = next_arg((int *)((long)&uStack_38 + 4),argc,argv);
        parse_file_operation(this,pcVar2);
        break;
      case 'q':
        this->quiet = true;
        break;
      case 't':
        pcVar2 = next_arg((int *)((long)&uStack_38 + 4),argc,argv);
        parse_match_mode(this,pcVar2);
        break;
      default:
        if ((pcVar2[1] == '-') && (iVar1 = strcmp(pcVar2 + 2,"help"), iVar1 == 0))
        goto LAB_00108bd0;
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'n':
      case 'r':
      case 's':
switchD_00108af8_caseD_69:
        ERROR("unknown argument: %s",pcVar2);
      }
    }
    else {
      if (iVar1 != argc + -1) goto switchD_00108af8_caseD_69;
      parse_input_add(this,pcVar2);
    }
    iVar1 = uStack_38._4_4_ + 1;
  } while( true );
}

Assistant:

args_t::args_t( int argc, const char * argv[] ) :
    input_master (NULL),
    input_add( stdin ),
    output( stdout ),
    op ( DEFAULT_OPERATION ),
    checks ( DEFAULT_MATCH ),
    quiet (false)
    {
        // skip arg[0], it's just the program name
        for (int i = 1; i < argc; ++i ) {
            const char * arg = argv[i];
            
            if ( arg[0] == '-' && arg[1] == '-' ) {
                if ( !strcmp( &arg[2], "help" ) ) help();
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else if ( arg[0] == '-' ) {
                if ( !strcmp( &arg[1], "h" ) ) help();
                else if (  arg[1] == 'o' ) parse_output( next_arg (i, argc, argv) );
                else if (  arg[1] == 'm')  parse_input_master( next_arg (i, argc, argv) );
                else if (  arg[1] == 'p')  parse_file_operation ( next_arg (i, argc, argv) );
                else if (  arg[1] == 't')  parse_match_mode( next_arg (i, argc, argv) );
                else if (  arg[1] == 'q')  parse_quiet ( );
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else
                if (i == argc-1) {
                    parse_input_add (arg);
                } else {
                    ERROR( "unknown argument: %s", arg );
                }
        }
        
        if (input_master == NULL) {
            ERROR ("Required argument MASTER FILE was not provided");
        }
    }